

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O3

void __thiscall Uic::writeHeaderProtectionStart(Uic *this)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  Driver::headerFileName(&local_38,this->drv);
  pQVar1 = (QTextStream *)QTextStream::operator<<(this->out,"#ifndef ");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,&local_38);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"\n");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"#define ");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,&local_38);
  QTextStream::operator<<(pQVar1,"\n");
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Uic::writeHeaderProtectionStart()
{
    QString h = drv->headerFileName();
    out << "#ifndef " << h << "\n"
        << "#define " << h << "\n";
}